

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

qulonglong QString::toIntegral_helper(QStringView string,bool *ok,uint base)

{
  long lVar1;
  unsigned_long_long uVar2;
  long in_FS_OFFSET;
  undefined1 in_stack_00000058 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = toIntegral<unsigned_long_long>((QStringView)in_stack_00000058,ok,base);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

qulonglong QString::toIntegral_helper(QStringView string, bool *ok, uint base)
{
    return toIntegral<qulonglong>(string, ok, base);
}